

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.cpp
# Opt level: O0

string * __thiscall
ninx::parser::element::Block::dump_abi_cxx11_(string *__return_storage_ptr__,Block *this,int level)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  ostream *poVar4;
  void *this_00;
  pointer pSVar5;
  allocator local_2c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  string local_288 [32];
  reference local_268;
  unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>
  *statement;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>
  *__range1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  allocator local_1e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  stringstream local_1a8 [8];
  stringstream s;
  ostream local_198 [380];
  int local_1c;
  Block *pBStack_18;
  int level_local;
  Block *this_local;
  
  local_1c = level;
  pBStack_18 = this;
  this_local = (Block *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  uVar3 = (ulong)local_1c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1e8,uVar3,'\t',&local_1e9);
  std::operator+(&local_1c8,&local_1e8,"Block {");
  poVar4 = std::operator<<(local_198,(string *)&local_1c8);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  iVar2 = local_1c + 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_240,(long)iVar2,'\t',(allocator *)((long)&__range1 + 7));
  std::operator+(&local_220,&local_240,"echoing ");
  poVar4 = std::operator<<(local_198,(string *)&local_220);
  bVar1 = is_echoing(this);
  this_00 = (void *)std::ostream::operator<<(poVar4,bVar1);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_240);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
  __end1 = std::
           vector<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>
           ::begin(&this->statements);
  statement = (unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>
               *)std::
                 vector<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>
                 ::end(&this->statements);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_*,_std::vector<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>_>
                                *)&statement);
    if (!bVar1) break;
    local_268 = __gnu_cxx::
                __normal_iterator<const_std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_*,_std::vector<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>_>
                ::operator*(&__end1);
    pSVar5 = std::
             unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>
             ::operator->(local_268);
    (*(pSVar5->super_ASTElement)._vptr_ASTElement[3])(local_288,pSVar5,(ulong)(local_1c + 1));
    poVar4 = std::operator<<(local_198,local_288);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_288);
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_*,_std::vector<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>_>
    ::operator++(&__end1);
  }
  uVar3 = (ulong)local_1c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2c8,uVar3,'\t',&local_2c9);
  std::operator+(&local_2a8,&local_2c8,"}");
  poVar4 = std::operator<<(local_198,(string *)&local_2a8);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string ninx::parser::element::Block::dump(int level) const {
    std::stringstream s;

    s << std::string(level, '\t') + "Block {" << std::endl;
    s << std::string(level + 1, '\t') + "echoing " << this->is_echoing() << std::endl;
    for (auto &statement : statements) {
        s << statement->dump(level + 1) << std::endl;
    }
    s << std::string(level, '\t') + "}" << std::endl;

    return s.str();
}